

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

bool __thiscall
cfgfile::details::parser_conffile_impl_t<cfgfile::qstring_trait_t>::start_tag_parsing
          (parser_conffile_impl_t<cfgfile::qstring_trait_t> *this,
          lexeme_t<cfgfile::qstring_trait_t> *lexeme,tag_t<cfgfile::qstring_trait_t> *tag)

{
  lexeme_type_t lVar1;
  input_stream_t<cfgfile::qstring_trait_t> *piVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  logic_error *plVar8;
  undefined1 local_198 [32];
  undefined4 uStack_178;
  undefined4 uStack_174;
  string_t local_170;
  string_t local_158;
  string_t local_140;
  string_t local_128;
  qstring_wrapper_t local_110;
  qstring_wrapper_t local_f8;
  qstring_wrapper_t local_e0;
  string local_c8;
  string local_a8;
  qstring_wrapper_t local_88;
  qstring_wrapper_t local_68;
  qstring_wrapper_t local_48;
  
  lVar1 = lexeme->m_type;
  if (lVar1 == null) {
    plVar8 = (logic_error *)__cxa_allocate_exception(0x28);
    local_198._0_8_ = local_198 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"Unexpected end of file. In file \"","");
    qstring_trait_t::from_ascii(&local_128,(string *)local_198);
    operator+(&local_110,&local_128,&((this->m_lex).m_stream)->m_file_name);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"\" on line ","");
    qstring_trait_t::from_ascii(&local_140,&local_a8);
    operator+(&local_f8,&local_110,&local_140);
    qstring_trait_t::to_string(&local_158,(this->m_lex).m_line_number);
    operator+(&local_e0,&local_f8,&local_158);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,".","");
    qstring_trait_t::from_ascii(&local_170,&local_c8);
    operator+(&local_88,&local_e0,&local_170);
    std::logic_error::logic_error(plVar8,"Please use desc() method of the exception.");
    *(undefined ***)plVar8 = &PTR__exception_t_00164c00;
    *(undefined8 *)(plVar8 + 0x10) = 0;
    *(undefined8 *)(plVar8 + 0x18) = 0;
    *(undefined8 *)(plVar8 + 0x20) = 0;
    pcVar3 = *(char16_t **)(plVar8 + 0x18);
    uVar5 = local_88.m_str.d.d._0_4_;
    uVar6 = local_88.m_str.d.d._4_4_;
    local_88.m_str.d.d = (Data *)0x0;
    *(undefined4 *)(plVar8 + 0x10) = uVar5;
    *(undefined4 *)(plVar8 + 0x14) = uVar6;
    *(undefined4 *)(plVar8 + 0x18) = local_88.m_str.d.ptr._0_4_;
    *(undefined4 *)(plVar8 + 0x1c) = local_88.m_str.d.ptr._4_4_;
    qVar4 = *(qsizetype *)(plVar8 + 0x20);
    *(qsizetype *)(plVar8 + 0x20) = local_88.m_str.d.size;
    local_88.m_str.d.ptr = pcVar3;
    local_88.m_str.d.size = qVar4;
    __cxa_throw(plVar8,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                exception_t<cfgfile::qstring_trait_t>::~exception_t);
  }
  if (lVar1 != finish) {
    if (lVar1 != start) {
      bVar7 = operator==(&(tag->m_name).m_str,&(lexeme->m_value).m_str);
      if (bVar7) {
        local_198._0_8_ = tag;
        std::
        deque<cfgfile::tag_t<cfgfile::qstring_trait_t>*,std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>*>>
        ::emplace_back<cfgfile::tag_t<cfgfile::qstring_trait_t>*>
                  ((deque<cfgfile::tag_t<cfgfile::qstring_trait_t>*,std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>*>>
                    *)&(this->super_parser_base_t<cfgfile::qstring_trait_t>).m_stack,
                   (tag_t<cfgfile::qstring_trait_t> **)local_198);
        piVar2 = (this->m_lex).m_stream;
        local_198._24_4_ = (undefined4)(this->m_lex).m_line_number;
        local_198._28_4_ = *(undefined4 *)((long)&(this->m_lex).m_line_number + 4);
        uStack_178 = (undefined4)(this->m_lex).m_column_number;
        uStack_174 = *(undefined4 *)((long)&(this->m_lex).m_column_number + 4);
        local_198._0_8_ = (piVar2->m_file_name).m_str.d.d;
        local_198._8_8_ = (piVar2->m_file_name).m_str.d.ptr;
        local_198._16_8_ = (piVar2->m_file_name).m_str.d.size;
        if ((tag_t<cfgfile::qstring_trait_t> *)local_198._0_8_ !=
            (tag_t<cfgfile::qstring_trait_t> *)0x0) {
          LOCK();
          (((QArrayData *)&((tag_t<cfgfile::qstring_trait_t> *)local_198._0_8_)->_vptr_tag_t)->ref_)
          ._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)&((tag_t<cfgfile::qstring_trait_t> *)local_198._0_8_)->_vptr_tag_t)->
               ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        (*tag->_vptr_tag_t[4])(tag);
        if ((tag_t<cfgfile::qstring_trait_t> *)local_198._0_8_ !=
            (tag_t<cfgfile::qstring_trait_t> *)0x0) {
          LOCK();
          *(int *)local_198._0_8_ = *(int *)local_198._0_8_ + -1;
          UNLOCK();
          if (*(int *)local_198._0_8_ == 0) {
            QArrayData::deallocate((QArrayData *)local_198._0_8_,2,8);
          }
        }
      }
      return bVar7;
    }
    plVar8 = (logic_error *)__cxa_allocate_exception(0x28);
    local_198._0_8_ = local_198 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,
               "Unexpected start curl brace. We expected tag name, but we\'ve got start curl brace. In file \""
               ,"");
    qstring_trait_t::from_ascii(&local_128,(string *)local_198);
    operator+(&local_110,&local_128,&((this->m_lex).m_stream)->m_file_name);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"\" on line ","");
    qstring_trait_t::from_ascii(&local_140,&local_a8);
    operator+(&local_f8,&local_110,&local_140);
    qstring_trait_t::to_string(&local_158,(this->m_lex).m_line_number);
    operator+(&local_e0,&local_f8,&local_158);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,".","");
    qstring_trait_t::from_ascii(&local_170,&local_c8);
    operator+(&local_48,&local_e0,&local_170);
    std::logic_error::logic_error(plVar8,"Please use desc() method of the exception.");
    *(undefined ***)plVar8 = &PTR__exception_t_00164c00;
    *(undefined8 *)(plVar8 + 0x10) = 0;
    *(undefined8 *)(plVar8 + 0x18) = 0;
    *(undefined8 *)(plVar8 + 0x20) = 0;
    pcVar3 = *(char16_t **)(plVar8 + 0x18);
    uVar5 = local_48.m_str.d.d._0_4_;
    uVar6 = local_48.m_str.d.d._4_4_;
    local_48.m_str.d.d = (Data *)0x0;
    *(undefined4 *)(plVar8 + 0x10) = uVar5;
    *(undefined4 *)(plVar8 + 0x14) = uVar6;
    *(undefined4 *)(plVar8 + 0x18) = local_48.m_str.d.ptr._0_4_;
    *(undefined4 *)(plVar8 + 0x1c) = local_48.m_str.d.ptr._4_4_;
    qVar4 = *(qsizetype *)(plVar8 + 0x20);
    *(qsizetype *)(plVar8 + 0x20) = local_48.m_str.d.size;
    local_48.m_str.d.ptr = pcVar3;
    local_48.m_str.d.size = qVar4;
    __cxa_throw(plVar8,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                exception_t<cfgfile::qstring_trait_t>::~exception_t);
  }
  plVar8 = (logic_error *)__cxa_allocate_exception(0x28);
  local_198._0_8_ = local_198 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_198,
             "Unexpected finish curl brace. We expected tag name, but we\'ve got finish curl brace. In file \""
             ,"");
  qstring_trait_t::from_ascii(&local_128,(string *)local_198);
  operator+(&local_110,&local_128,&((this->m_lex).m_stream)->m_file_name);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"\" on line ","");
  qstring_trait_t::from_ascii(&local_140,&local_a8);
  operator+(&local_f8,&local_110,&local_140);
  qstring_trait_t::to_string(&local_158,(this->m_lex).m_line_number);
  operator+(&local_e0,&local_f8,&local_158);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,".","");
  qstring_trait_t::from_ascii(&local_170,&local_c8);
  operator+(&local_68,&local_e0,&local_170);
  std::logic_error::logic_error(plVar8,"Please use desc() method of the exception.");
  *(undefined ***)plVar8 = &PTR__exception_t_00164c00;
  *(undefined8 *)(plVar8 + 0x10) = 0;
  *(undefined8 *)(plVar8 + 0x18) = 0;
  *(undefined8 *)(plVar8 + 0x20) = 0;
  pcVar3 = *(char16_t **)(plVar8 + 0x18);
  uVar5 = local_68.m_str.d.d._0_4_;
  uVar6 = local_68.m_str.d.d._4_4_;
  local_68.m_str.d.d = (Data *)0x0;
  *(undefined4 *)(plVar8 + 0x10) = uVar5;
  *(undefined4 *)(plVar8 + 0x14) = uVar6;
  *(undefined4 *)(plVar8 + 0x18) = local_68.m_str.d.ptr._0_4_;
  *(undefined4 *)(plVar8 + 0x1c) = local_68.m_str.d.ptr._4_4_;
  qVar4 = *(qsizetype *)(plVar8 + 0x20);
  *(qsizetype *)(plVar8 + 0x20) = local_68.m_str.d.size;
  local_68.m_str.d.ptr = pcVar3;
  local_68.m_str.d.size = qVar4;
  __cxa_throw(plVar8,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
              exception_t<cfgfile::qstring_trait_t>::~exception_t);
}

Assistant:

bool start_tag_parsing( const lexeme_t< Trait > & lexeme,
		tag_t< Trait > & tag )
	{
		if( lexeme.type() == lexeme_type_t::start )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected start curl brace. "
					"We expected tag name, but we've got start curl brace. "
					"In file \"" ) + m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
		else if( lexeme.type() == lexeme_type_t::finish )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected finish curl brace. "
					"We expected tag name, but we've got finish curl brace. "
					"In file \"" ) + m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
		else if( lexeme.type() == lexeme_type_t::null )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected end of file. "
					"In file \"" ) + m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
		else if( tag.name() == lexeme.value() )
		{
			this->m_stack.push( &tag );

			tag.on_start( parser_info_t< Trait >(
				m_lex.input_stream().file_name(),
				m_lex.line_number(),
				m_lex.column_number() ) );

			return true;
		}

		return false;
	}